

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

htmlDocPtr htmlSAXParseDoc(xmlChar *cur,char *encoding,htmlSAXHandlerPtr sax,void *userData)

{
  xmlDocPtr pxVar1;
  htmlParserCtxtPtr ctxt;
  
  xmlInitParser();
  if ((cur != (xmlChar *)0x0) &&
     (ctxt = htmlCreateDocParserCtxt(cur,encoding), ctxt != (htmlParserCtxtPtr)0x0)) {
    if (sax != (htmlSAXHandlerPtr)0x0) {
      if (ctxt->sax != (_xmlSAXHandler *)0x0) {
        (*xmlFree)(ctxt->sax);
      }
      ctxt->sax = sax;
      ctxt->userData = userData;
    }
    htmlParseDocument(ctxt);
    if (sax != (htmlSAXHandlerPtr)0x0) {
      ctxt->sax = (_xmlSAXHandler *)0x0;
      ctxt->userData = (void *)0x0;
    }
    pxVar1 = ctxt->myDoc;
    xmlFreeParserCtxt(ctxt);
    return pxVar1;
  }
  return (htmlDocPtr)0x0;
}

Assistant:

htmlDocPtr
htmlSAXParseDoc(const xmlChar *cur, const char *encoding,
                htmlSAXHandlerPtr sax, void *userData) {
    htmlDocPtr ret;
    htmlParserCtxtPtr ctxt;

    xmlInitParser();

    if (cur == NULL) return(NULL);


    ctxt = htmlCreateDocParserCtxt(cur, encoding);
    if (ctxt == NULL) return(NULL);
    if (sax != NULL) {
        if (ctxt->sax != NULL) xmlFree (ctxt->sax);
        ctxt->sax = sax;
        ctxt->userData = userData;
    }

    htmlParseDocument(ctxt);
    ret = ctxt->myDoc;
    if (sax != NULL) {
	ctxt->sax = NULL;
	ctxt->userData = NULL;
    }
    htmlFreeParserCtxt(ctxt);

    return(ret);
}